

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRHandler.cc
# Opt level: O2

void __thiscall flow::IRHandler::erase(IRHandler *this,BasicBlock *bb)

{
  pointer puVar1;
  FILE *__stream;
  TerminateInstr *pTVar2;
  list<std::unique_ptr<flow::BasicBlock,_std::default_delete<flow::BasicBlock>_>,_std::allocator<std::unique_ptr<flow::BasicBlock,_std::default_delete<flow::BasicBlock>_>_>_>
  *this_00;
  pointer puVar3;
  const_iterator __position;
  allocator<char> local_51;
  undefined1 local_50 [40];
  
  __stream = _stderr;
  this_00 = &this->blocks_;
  __position._M_node = (_List_node_base *)this_00;
  do {
    __position._M_node = (__position._M_node)->_M_next;
    if (__position._M_node == (_List_node_base *)this_00) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)(local_50 + 8),
                 "Given basic block must be a member of this handler to be removed.",&local_51);
      fprintf(__stream,"%s\n",local_50._8_8_);
      std::__cxx11::string::~string((string *)(local_50 + 8));
      abort();
    }
  } while ((BasicBlock *)__position._M_node[1]._M_next != bb);
  puVar1 = (bb->code_).
           super__Vector_base<std::unique_ptr<flow::Instr,_std::default_delete<flow::Instr>_>,_std::allocator<std::unique_ptr<flow::Instr,_std::default_delete<flow::Instr>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (puVar3 = (bb->code_).
                super__Vector_base<std::unique_ptr<flow::Instr,_std::default_delete<flow::Instr>_>,_std::allocator<std::unique_ptr<flow::Instr,_std::default_delete<flow::Instr>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start; puVar3 != puVar1; puVar3 = puVar3 + 1) {
    Instr::clearOperands
              ((puVar3->_M_t).super___uniq_ptr_impl<flow::Instr,_std::default_delete<flow::Instr>_>.
               _M_t.super__Tuple_impl<0UL,_flow::Instr_*,_std::default_delete<flow::Instr>_>.
               super__Head_base<0UL,_flow::Instr_*,_false>._M_head_impl);
  }
  pTVar2 = BasicBlock::getTerminator(bb);
  if (pTVar2 != (TerminateInstr *)0x0) {
    BasicBlock::remove((BasicBlock *)local_50,(char *)__position._M_node[1]._M_next);
    if ((_func_int **)local_50._0_8_ != (_func_int **)0x0) {
      (**(code **)(*(_func_int **)local_50._0_8_ + 8))();
    }
    local_50._0_8_ = (_func_int **)0x0;
  }
  std::__cxx11::
  list<std::unique_ptr<flow::BasicBlock,_std::default_delete<flow::BasicBlock>_>,_std::allocator<std::unique_ptr<flow::BasicBlock,_std::default_delete<flow::BasicBlock>_>_>_>
  ::erase(this_00,__position);
  return;
}

Assistant:

void IRHandler::erase(BasicBlock* bb) {
  auto i = std::find_if(blocks_.begin(), blocks_.end(),
                        [&](const auto& obj) { return obj.get() == bb; });
  FLOW_ASSERT(i != blocks_.end(),
              "Given basic block must be a member of this handler to be removed.");

  for (Instr* instr : bb->instructions()) {
    instr->clearOperands();
  }

  if (TerminateInstr* terminator = bb->getTerminator()) {
    (*i)->remove(terminator);
  }

  blocks_.erase(i);
}